

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O3

void __thiscall embree::BVHN<4>::postBuild(BVHN<4> *this,double t0)

{
  __int_type_conflict _Var1;
  bool bVar2;
  BVHNStatistics<4> *this_00;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  pointer ppBVar6;
  pointer ppBVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Lock<embree::MutexSys> lock_1;
  Lock<embree::MutexSys> lock;
  double local_168;
  undefined1 local_158 [32];
  size_t local_138;
  size_t sStack_130;
  size_t local_128;
  size_t sStack_120;
  size_t local_118;
  size_t sStack_110;
  size_t local_108;
  size_t sStack_100;
  size_t local_f8;
  size_t sStack_f0;
  size_t local_e8;
  size_t sStack_e0;
  size_t local_d8;
  size_t sStack_d0;
  undefined8 *local_c8;
  undefined1 local_c0;
  AllStatistics local_b8;
  
  if (INFINITY <= t0) {
    return;
  }
  if ((this->device->super_State).benchmark == 0) {
    bVar2 = State::verbosity(&this->device->super_State,2);
    local_168 = 0.0;
    if (bVar2) goto LAB_00b79f40;
  }
  else {
LAB_00b79f40:
    local_168 = getSeconds();
    local_168 = local_168 - t0;
  }
  bVar2 = State::verbosity(&this->device->super_State,2);
  if (bVar2) {
    this_00 = (BVHNStatistics<4> *)::operator_new(0x110);
    BVHNStatistics<4>::BVHNStatistics(this_00,this);
    _Var1 = (this->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i;
    local_c8 = &g_printMutex;
    local_c0 = 1;
    MutexSys::lock((MutexSys *)&g_printMutex);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"finished BVH",0xc);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<",1);
    pcVar4 = (char *)(**(code **)**(undefined8 **)&(this->super_AccelData).field_0x58)();
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"> : ",4);
    poVar3 = std::ostream::_M_insert<double>(local_168 * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ms, ",4);
    auVar10._0_8_ = (double)CONCAT44(0x43300000,(int)this->numPrimitives);
    auVar10._8_4_ = (int)(this->numPrimitives >> 0x20);
    auVar10._12_4_ = 0x45300000;
    poVar3 = std::ostream::_M_insert<double>
                       ((((auVar10._8_8_ - 1.9342813113834067e+25) +
                         (auVar10._0_8_ - 4503599627370496.0)) * 1e-06) / local_168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," Mprim/s, ",10);
    auVar11._8_4_ = (int)(_Var1 >> 0x20);
    auVar11._0_8_ = _Var1;
    auVar11._12_4_ = 0x45300000;
    poVar3 = std::ostream::_M_insert<double>
                       ((((auVar11._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)_Var1) - 4503599627370496.0)) * 1e-09) /
                        local_168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," GB/s",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    bVar2 = State::verbosity(&this->device->super_State,2);
    if (bVar2) {
      BVHNStatistics<4>::str_abi_cxx11_((string *)local_158,this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_158._0_8_,local_158._8_8_);
      if ((MutexSys *)local_158._0_8_ != (MutexSys *)(local_158 + 0x10)) {
        ::operator_delete((void *)local_158._0_8_);
      }
    }
    bVar2 = State::verbosity(&this->device->super_State,2);
    if (bVar2) {
      FastAllocator::AllStatistics::AllStatistics((AllStatistics *)local_158,&this->alloc);
      ppBVar6 = (this->objects).
                super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppBVar7 = (this->objects).
                super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppBVar7 != ppBVar6) {
        uVar8 = 0;
        do {
          if (ppBVar6[uVar8] != (BVHN<4> *)0x0) {
            FastAllocator::AllStatistics::AllStatistics(&local_b8,&ppBVar6[uVar8]->alloc);
            local_158._0_8_ = local_158._0_8_ + local_b8.bytesUsed;
            local_158._8_8_ = local_b8.bytesFree + local_158._8_8_;
            local_158._16_8_ = local_b8.bytesWasted + local_158._16_8_;
            local_158._24_8_ = local_b8.stat_all.bytesUsed + local_158._24_8_;
            local_138 = local_b8.stat_all.bytesFree + local_138;
            sStack_130 = local_b8.stat_all.bytesWasted + sStack_130;
            local_128 = local_b8.stat_malloc.bytesUsed + local_128;
            sStack_120 = local_b8.stat_malloc.bytesFree + sStack_120;
            local_118 = local_b8.stat_malloc.bytesWasted + local_118;
            sStack_110 = local_b8.stat_4K.bytesUsed + sStack_110;
            local_108 = local_b8.stat_4K.bytesFree + local_108;
            sStack_100 = local_b8.stat_4K.bytesWasted + sStack_100;
            local_f8 = local_b8.stat_2M.bytesUsed + local_f8;
            sStack_f0 = local_b8.stat_2M.bytesFree + sStack_f0;
            local_e8 = local_b8.stat_2M.bytesWasted + local_e8;
            sStack_e0 = local_b8.stat_shared.bytesUsed + sStack_e0;
            local_d8 = local_b8.stat_shared.bytesFree + local_d8;
            sStack_d0 = local_b8.stat_shared.bytesWasted + sStack_d0;
            ppBVar6 = (this->objects).
                      super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppBVar7 = (this->objects).
                      super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)((long)ppBVar7 - (long)ppBVar6 >> 3));
      }
      FastAllocator::AllStatistics::print((AllStatistics *)local_158,this->numPrimitives);
    }
    bVar2 = State::verbosity(&this->device->super_State,3);
    if (bVar2) {
      FastAllocator::print_blocks(&this->alloc);
      ppBVar6 = (this->objects).
                super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppBVar7 = (this->objects).
                super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppBVar7 != ppBVar6) {
        uVar8 = 0;
        do {
          if (ppBVar6[uVar8] != (BVHN<4> *)0x0) {
            FastAllocator::print_blocks(&ppBVar6[uVar8]->alloc);
            ppBVar6 = (this->objects).
                      super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            ppBVar7 = (this->objects).
                      super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)((long)ppBVar7 - (long)ppBVar6 >> 3));
      }
    }
    std::ostream::flush();
    MutexSys::unlock((MutexSys *)&g_printMutex);
    if ((this->device->super_State).benchmark == 0) goto LAB_00b7a587;
  }
  else {
    if ((this->device->super_State).benchmark == 0) {
      return;
    }
    this_00 = (BVHNStatistics<4> *)::operator_new(0x110);
    BVHNStatistics<4>::BVHNStatistics(this_00,this);
  }
  local_158._0_8_ = &g_printMutex;
  local_158[8] = 1;
  MutexSys::lock((MutexSys *)&g_printMutex);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BENCHMARK_BUILD ",0x10);
  poVar3 = std::ostream::_M_insert<double>(local_168);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  auVar12._0_8_ = (double)CONCAT44(0x43300000,(int)this->numPrimitives);
  auVar12._8_4_ = (int)(this->numPrimitives >> 0x20);
  auVar12._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     (((auVar12._8_8_ - 1.9342813113834067e+25) +
                      (auVar12._0_8_ - 4503599627370496.0)) / local_168);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  dVar9 = BVHNStatistics<4>::Statistics::sah(&this_00->stat,this_00->bvh);
  poVar3 = std::ostream::_M_insert<double>(dVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," BVH",4);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<",1);
  pcVar4 = (char *)(**(code **)**(undefined8 **)&(this->super_AccelData).field_0x58)();
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::ostream::flush();
  if (local_158[8] == '\x01') {
    MutexSys::unlock((MutexSys *)local_158._0_8_);
  }
LAB_00b7a587:
  ::operator_delete(this_00);
  return;
}

Assistant:

void BVHN<N>::postBuild(double t0)
  {
    if (t0 == double(inf))
      return;
    
    double dt = 0.0;
    if (device->benchmark || device->verbosity(2)) 
      dt = getSeconds()-t0;

    std::unique_ptr<BVHNStatistics<N>> stat;

    /* print statistics */
    if (device->verbosity(2))
    {
      if (!stat) stat.reset(new BVHNStatistics<N>(this));
      const size_t usedBytes = alloc.getUsedBytes();
      Lock<MutexSys> lock(g_printMutex);
      std::cout << "finished BVH" << N << "<" << primTy->name() << "> : " << 1000.0f*dt << "ms, " << 1E-6*double(numPrimitives)/dt << " Mprim/s, " << 1E-9*double(usedBytes)/dt << " GB/s" << std::endl;
    
      if (device->verbosity(2))
        std::cout << stat->str();

      if (device->verbosity(2))
      {
        FastAllocator::AllStatistics stat(&alloc);
        for (size_t i=0; i<objects.size(); i++)
          if (objects[i])
            stat = stat + FastAllocator::AllStatistics(&objects[i]->alloc);

        stat.print(numPrimitives);
      }

      if (device->verbosity(3))
      {
        alloc.print_blocks();
        for (size_t i=0; i<objects.size(); i++)
          if (objects[i]) 
            objects[i]->alloc.print_blocks();
      }

      std::cout << std::flush;
    }

    /* benchmark mode */
    if (device->benchmark)
    {
      if (!stat) stat.reset(new BVHNStatistics<N>(this));
      Lock<MutexSys> lock(g_printMutex);
      std::cout << "BENCHMARK_BUILD " << dt << " " << double(numPrimitives)/dt << " " << stat->sah() << " " << stat->bytesUsed() << " BVH" << N << "<" << primTy->name() << ">" << std::endl << std::flush;
    }
  }